

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int wally_tx_input_init_alloc
              (uchar *txhash,size_t txhash_len,uint32_t utxo_index,uint32_t sequence,uchar *script,
              size_t script_len,wally_tx_witness_stack *witness,wally_tx_input **output)

{
  int iVar1;
  wally_tx_input *output_00;
  
  if (output == (wally_tx_input **)0x0) {
    iVar1 = -2;
  }
  else {
    *output = (wally_tx_input *)0x0;
    output_00 = (wally_tx_input *)wally_calloc(0xd0);
    *output = output_00;
    if (output_00 == (wally_tx_input *)0x0) {
      iVar1 = -3;
    }
    else {
      iVar1 = tx_elements_input_init
                        (txhash,txhash_len,utxo_index,sequence,script,script_len,witness,
                         (uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,
                         (uchar *)0x0,0,(wally_tx_witness_stack *)0x0,output_00,false);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        clear_and_free(output_00,0xd0);
        *output = (wally_tx_input *)0x0;
      }
    }
  }
  return iVar1;
}

Assistant:

int wally_tx_input_init_alloc(const unsigned char *txhash, size_t txhash_len,
                              uint32_t utxo_index, uint32_t sequence,
                              const unsigned char *script, size_t script_len,
                              const struct wally_tx_witness_stack *witness,
                              struct wally_tx_input **output)
{
    struct wally_tx_input *result;
    int ret;

    TX_CHECK_OUTPUT;
    TX_OUTPUT_ALLOC(struct wally_tx_input);

    ret = wally_tx_input_init(txhash, txhash_len, utxo_index, sequence,
                              script, script_len, witness, result);

    if (ret != WALLY_OK) {
        clear_and_free(result, sizeof(*result));
        *output = NULL;
    }
    return ret;
}